

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_cab.c
# Opt level: O1

void * cab_read_ahead_cfdata(archive_read *a,ssize_t *avail)

{
  lzx_br *br;
  lzx_stream *strm;
  char cVar1;
  undefined1 uVar2;
  short sVar3;
  ushort uVar4;
  ushort uVar5;
  wchar_t wVar6;
  uint uVar7;
  long lVar8;
  int *piVar9;
  int *piVar10;
  undefined4 *puVar11;
  long lVar12;
  bool bVar13;
  uint uVar14;
  uint uVar15;
  byte bVar16;
  wchar_t wVar17;
  uint uVar18;
  uint uVar19;
  wchar_t wVar20;
  wchar_t wVar21;
  int iVar22;
  void *pvVar23;
  void *pvVar24;
  int64_t iVar25;
  byte *pbVar26;
  ulong uVar27;
  void *pvVar28;
  uint uVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  ulong uVar33;
  undefined4 uVar34;
  ulong uVar35;
  char *pcVar36;
  undefined4 uVar37;
  undefined1 *puVar38;
  ulong uVar39;
  uint uVar40;
  uint uVar41;
  uchar *p;
  int iVar42;
  int *piVar43;
  uint uVar44;
  undefined1 *__dest;
  size_t __n;
  void *pvVar45;
  wchar_t wVar46;
  ssize_t bytes_avail;
  ssize_t bytes_avail_1;
  uint local_164;
  uint local_158;
  uint local_144;
  uint local_13c;
  lzx_br local_d8 [5];
  ulong local_88;
  long local_80;
  ulong local_78;
  uint local_70;
  int local_6c;
  byte *local_68;
  long local_60;
  long local_58;
  long local_50;
  undefined4 *local_48;
  size_t local_40;
  long local_38;
  
  pvVar23 = a->format->data;
  wVar17 = cab_next_cfdata(a);
  if (wVar17 < L'\0') {
    *avail = (long)wVar17;
    return (void *)0x0;
  }
  lVar8 = *(long *)((long)pvVar23 + 0x28);
  sVar3 = *(short *)(lVar8 + 6);
  if (sVar3 == 3) {
    pvVar23 = a->format->data;
    lVar8 = *(long *)((long)pvVar23 + 0x38);
    if (*(long *)((long)pvVar23 + 0xa0) == 0) {
      *(undefined8 *)((long)pvVar23 + 0xa8) = 0x8000;
      pvVar24 = malloc(0x8000);
      *(void **)((long)pvVar23 + 0xa0) = pvVar24;
      if (pvVar24 == (void *)0x0) {
        pcVar36 = "No memory for CAB reader";
        iVar22 = 0xc;
        goto LAB_0023b118;
      }
    }
    uVar4 = *(ushort *)(lVar8 + 0xc);
    uVar27 = (ulong)uVar4;
    if (uVar4 == *(ushort *)(lVar8 + 8)) {
      uVar4 = *(ushort *)(lVar8 + 0xe);
      lVar8 = *(long *)((long)pvVar23 + 0xa0);
      *avail = uVar27 - uVar4;
      return (void *)((ulong)uVar4 + lVar8);
    }
    if (*(char *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) != '\0') {
LAB_00239a76:
      lVar32 = *(long *)((long)pvVar23 + 0x1b8);
      *(undefined4 *)(lVar32 + 0x70) = 0;
      *(undefined1 *)(lVar32 + 0x75) = 0;
      *(ulong *)((long)pvVar23 + 0x1b0) = uVar27;
      uVar33 = (ulong)*(ushort *)(lVar8 + 8);
      if (uVar4 < *(ushort *)(lVar8 + 8)) {
        strm = (lzx_stream *)((long)pvVar23 + 0x188);
LAB_00239aac:
        *(ulong *)((long)pvVar23 + 0x1a0) = uVar27 + *(long *)((long)pvVar23 + 0xa0);
        *(ulong *)((long)pvVar23 + 0x1a8) = uVar33 - uVar27;
        pbVar26 = (byte *)__archive_read_ahead(a,1,(ssize_t *)&local_78);
        if (pbVar26 != (byte *)0x0) {
          uVar27 = (ulong)*(ushort *)(lVar8 + 6);
          if ((long)uVar27 < (long)local_78) {
            local_78 = uVar27;
          }
          uVar33 = local_78;
          *(byte **)((long)pvVar23 + 0x188) = pbVar26;
          *(ulong *)((long)pvVar23 + 400) = local_78;
          *(undefined8 *)((long)pvVar23 + 0x198) = 0;
          piVar9 = *(int **)((long)pvVar23 + 0x1b8);
          uVar44 = piVar9[0x87];
          local_68 = pbVar26;
          if (uVar44 == 0) {
            iVar22 = piVar9[0x1c];
            if ((0 < (long)local_78 && *(char *)((long)piVar9 + 0x75) != '\0') &&
                iVar22 + -0x41 < -0x10) {
              *(ulong *)(piVar9 + 0x1a) =
                   (ulong)*(byte *)(piVar9 + 0x1d) |
                   (ulong)*pbVar26 << 8 | *(long *)(piVar9 + 0x1a) << 0x10;
              *(byte **)((long)pvVar23 + 0x188) = pbVar26 + 1;
              *(ulong *)((long)pvVar23 + 400) = local_78 - 1;
              piVar9[0x1c] = iVar22 + 0x10;
              *(undefined1 *)((long)piVar9 + 0x75) = 0;
            }
            iVar22 = (uint)(local_78 == uVar27) * 4 + 1;
            local_70 = (local_78 == uVar27) + 7;
LAB_00239bec:
            if (*piVar9 < 0x12) {
              piVar10 = *(int **)((long)pvVar23 + 0x1b8);
              br = (lzx_br *)(piVar10 + 0x1a);
switchD_00239c17_default:
              switch(*piVar10) {
              case 0:
                if (((piVar10[0x1c] < 1) && (wVar17 = lzx_br_fillup(strm,br), wVar17 == L'\0')) &&
                   (piVar10[0x1c] < 1)) {
                  *piVar10 = 0;
                  goto LAB_0023ac15;
                }
                *(bool *)(piVar10 + 10) =
                     (*(ulong *)(piVar10 + 0x1a) >> ((ulong)(piVar10[0x1c] - 1U) & 0x3f) & 1) != 0;
                piVar10[0x1c] = piVar10[0x1c] - 1U;
                break;
              case 2:
                goto switchD_00239c17_caseD_2;
              case 3:
                goto switchD_00239c17_caseD_3;
              case 4:
                goto switchD_00239c17_caseD_4;
              case 5:
              case 6:
              case 7:
                goto switchD_00239c17_caseD_5;
              case 8:
                goto switchD_00239c17_caseD_8;
              case 9:
                goto switchD_00239c17_caseD_9;
              case 10:
                if (((SBORROW4(piVar10[0x1c],piVar10[0x1e] * 3) !=
                      piVar10[0x1c] + piVar10[0x1e] * -3 < 0) &&
                    (wVar17 = lzx_br_fillup(strm,br), wVar17 == L'\0')) &&
                   (SBORROW4(piVar10[0x1c],piVar10[0x1e] * 3) !=
                    piVar10[0x1c] + piVar10[0x1e] * -3 < 0)) {
                  *piVar10 = 10;
                  goto LAB_0023ac15;
                }
                piVar10[0x2b] = 0;
                piVar10[0x2c] = 0;
                piVar10[0x2d] = 0;
                piVar10[0x2e] = 0;
                piVar10[0x27] = 0;
                piVar10[0x28] = 0;
                piVar10[0x29] = 0;
                piVar10[0x2a] = 0;
                piVar10[0x23] = 0;
                piVar10[0x24] = 0;
                piVar10[0x25] = 0;
                piVar10[0x26] = 0;
                piVar10[0x1f] = 0;
                piVar10[0x20] = 0;
                piVar10[0x21] = 0;
                piVar10[0x22] = 0;
                piVar10[0x2f] = 0;
                if (0 < piVar10[0x1e]) {
                  lVar32 = 0;
                  do {
                    *(byte *)(*(long *)(piVar10 + 0x30) + lVar32) =
                         (byte)(*(ulong *)(piVar10 + 0x1a) >> ((char)piVar10[0x1c] - 3U & 0x3f)) & 7
                    ;
                    piVar10[(ulong)*(byte *)(*(long *)(piVar10 + 0x30) + lVar32) + 0x1f] =
                         piVar10[(ulong)*(byte *)(*(long *)(piVar10 + 0x30) + lVar32) + 0x1f] + 1;
                    piVar10[0x1c] = piVar10[0x1c] + -3;
                    lVar32 = lVar32 + 1;
                  } while (lVar32 < piVar10[0x1e]);
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x1e));
                if (wVar17 == L'\0') goto LAB_0023ac21;
switchD_00239c17_caseD_b:
                piVar10[0x86] = 0;
switchD_00239c17_caseD_c:
                wVar17 = lzx_read_pre_tree(strm);
                if (wVar17 == L'\0') {
                  *piVar10 = 0xc;
                  goto LAB_0023ac15;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x6c));
                if (wVar17 == L'\0') goto LAB_0023ac21;
                piVar10[0x86] = 0;
switchD_00239c17_caseD_d:
                wVar17 = lzx_read_bitlen(strm,(huffman *)(piVar10 + 0x52),L'Ā');
                if (wVar17 < L'\0') goto LAB_0023ac21;
                if (wVar17 == L'\0') {
                  *piVar10 = 0xd;
                  goto LAB_0023ac15;
                }
                piVar10[0x86] = 0;
switchD_00239c17_caseD_e:
                wVar17 = lzx_read_pre_tree(strm);
                if (wVar17 == L'\0') {
                  *piVar10 = 0xe;
                  goto LAB_0023ac15;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x6c));
                if (wVar17 == L'\0') goto LAB_0023ac21;
                piVar10[0x86] = 0x100;
switchD_00239c17_caseD_f:
                wVar17 = lzx_read_bitlen(strm,(huffman *)(piVar10 + 0x52),L'\xffffffff');
                if (wVar17 < L'\0') goto LAB_0023ac21;
                if (wVar17 == L'\0') {
                  *piVar10 = 0xf;
                  goto LAB_0023ac15;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x52));
                if (wVar17 == L'\0') goto LAB_0023ac21;
                piVar10[0x86] = 0;
switchD_00239c17_caseD_10:
                wVar17 = lzx_read_pre_tree(strm);
                if (wVar17 == L'\0') {
                  *piVar10 = 0x10;
                  goto LAB_0023ac15;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x6c));
                if (wVar17 == L'\0') goto LAB_0023ac21;
                piVar10[0x86] = 0;
switchD_00239c17_caseD_11:
                wVar17 = lzx_read_bitlen(strm,(huffman *)(piVar10 + 0x38),L'\xffffffff');
                if (wVar17 < L'\0') goto LAB_0023ac21;
                if (wVar17 == L'\0') {
                  *piVar10 = 0x11;
                  goto LAB_0023ac15;
                }
                wVar17 = lzx_make_huffman_table((huffman *)(piVar10 + 0x38));
                if (wVar17 == L'\0') goto LAB_0023ac21;
                *piVar10 = 0x12;
                uVar44 = 100;
                goto LAB_0023aca9;
              case 0xb:
                goto switchD_00239c17_caseD_b;
              case 0xc:
                goto switchD_00239c17_caseD_c;
              case 0xd:
                goto switchD_00239c17_caseD_d;
              case 0xe:
                goto switchD_00239c17_caseD_e;
              case 0xf:
                goto switchD_00239c17_caseD_f;
              case 0x10:
                goto switchD_00239c17_caseD_10;
              case 0x11:
                goto switchD_00239c17_caseD_11;
              default:
                goto switchD_00239c17_default;
              }
              if ((char)piVar10[10] != '\0') {
                if (((piVar10[0x1c] < 0x20) && (wVar17 = lzx_br_fillup(strm,br), wVar17 == L'\0'))
                   && (piVar10[0x1c] < 0x20)) {
                  *piVar10 = 1;
                  goto LAB_0023ac15;
                }
                iVar31 = piVar10[0x1c] + -0x20;
                piVar10[9] = (uint)(*(ulong *)(piVar10 + 0x1a) >> ((byte)iVar31 & 0x3f)) & 0xffff |
                             (int)(*(ulong *)(piVar10 + 0x1a) >>
                                  ((char)piVar10[0x1c] - 0x10U & 0x3f)) << 0x10;
                piVar10[0x1c] = iVar31;
              }
switchD_00239c17_caseD_2:
              if (((piVar10[0x1c] < 3) && (wVar17 = lzx_br_fillup(strm,br), wVar17 == L'\0')) &&
                 (piVar10[0x1c] < 3)) {
                *piVar10 = 2;
                goto LAB_0023ac15;
              }
              bVar16 = (byte)(*(ulong *)(piVar10 + 0x1a) >> ((byte)(piVar10[0x1c] + -3) & 0x3f)) & 7
              ;
              *(byte *)((long)piVar10 + 0x29) = bVar16;
              piVar10[0x1c] = piVar10[0x1c] + -3;
              if (2 < (byte)(bVar16 - 1)) goto LAB_0023ac21;
switchD_00239c17_caseD_3:
              if (((piVar10[0x1c] < 0x18) && (wVar17 = lzx_br_fillup(strm,br), wVar17 == L'\0')) &&
                 (piVar10[0x1c] < 0x18)) {
                *piVar10 = 3;
                goto LAB_0023ac15;
              }
              iVar31 = piVar10[0x1c] + -0x18;
              uVar39 = *(ulong *)(piVar10 + 0x1a) >> ((byte)iVar31 & 0x3f) & 0xffff |
                       (ulong)(((uint)(*(ulong *)(piVar10 + 0x1a) >>
                                      ((char)piVar10[0x1c] - 8U & 0x3f)) & 0xff) << 0x10);
              *(ulong *)(piVar10 + 0xc) = uVar39;
              piVar10[0x1c] = iVar31;
              if (uVar39 == 0) goto LAB_0023ac21;
              *(ulong *)(piVar10 + 0xe) = uVar39;
              iVar31 = 0xb;
              if (*(char *)((long)piVar10 + 0x29) != '\x01') {
                if (*(char *)((long)piVar10 + 0x29) == '\x03') goto switchD_00239c17_caseD_4;
                iVar31 = 10;
              }
              *piVar10 = iVar31;
              goto switchD_00239c17_default;
            }
            local_38 = *(long *)((long)pvVar23 + 0x1a8);
            puVar11 = *(undefined4 **)((long)pvVar23 + 0x1b8);
            local_48 = puVar11 + 0x1a;
            local_d8[0].cache_buffer = *(uint64_t *)(puVar11 + 0x1a);
            local_d8[0].cache_avail = puVar11[0x1c];
            local_d8[0]._12_4_ = puVar11[0x1d];
            local_58 = *(long *)(puVar11 + 0x18);
            __dest = *(undefined1 **)((long)pvVar23 + 0x1a0);
            puVar38 = __dest + local_38;
            lVar32 = *(long *)(puVar11 + 4);
            local_60 = *(long *)(puVar11 + 0x30);
            local_50 = *(long *)(puVar11 + 0x4a);
            lVar12 = *(long *)(puVar11 + 100);
            uVar39 = *(ulong *)(puVar11 + 0xe);
            local_80 = (long)(int)puVar11[0x32];
            wVar17 = puVar11[0x4c];
            wVar6 = puVar11[0x66];
            uVar18 = puVar11[8];
            cVar1 = *(char *)((long)puVar11 + 0x29);
            uVar40 = puVar11[6];
            uVar7 = puVar11[2];
            local_6c = puVar11[1];
            uVar19 = puVar11[0x15];
            local_88 = (ulong)(uint)puVar11[0x17];
            local_158 = puVar11[0x16];
            local_164 = puVar11[0x10];
            uVar37 = *puVar11;
            uVar44 = puVar11[7];
            uVar29 = puVar11[0x12];
            uVar14 = puVar11[0x11];
switchD_00239e96_default:
            local_144 = uVar14;
            local_13c = uVar29;
            uVar41 = uVar44;
            uVar34 = uVar37;
            uVar15 = local_164;
            uVar37 = uVar34;
            uVar44 = uVar41;
            uVar29 = local_13c;
            uVar14 = local_144;
            switch(uVar34) {
            case 0x12:
              while( true ) {
                if (uVar39 == 0) {
                  *puVar11 = 2;
                  local_d8[0].cache_buffer._4_4_ = (undefined4)(local_d8[0].cache_buffer >> 0x20);
                  *local_48 = (int)local_d8[0].cache_buffer;
                  local_48[1] = local_d8[0].cache_buffer._4_4_;
                  local_48[2] = local_d8[0].cache_avail;
                  local_48[3] = local_d8[0]._12_4_;
                  *(undefined8 *)(puVar11 + 0xe) = 0;
                  puVar11[8] = uVar18;
                  puVar11[7] = uVar41;
                  puVar11[0x15] = uVar19;
                  puVar11[0x16] = local_158;
                  puVar11[0x10] = local_164;
                  puVar11[0x11] = local_144;
                  puVar11[0x12] = local_13c;
                  puVar11[6] = uVar40;
                  *(long *)((long)pvVar23 + 0x1a8) = (long)puVar38 - (long)__dest;
                  uVar44 = 1;
                  goto LAB_0023ac87;
                }
                if (puVar38 <= __dest) goto LAB_0023a5d5;
                if (((local_d8[0].cache_avail < wVar6) &&
                    (wVar46 = lzx_br_fillup(strm,local_d8), wVar46 == L'\0')) &&
                   (local_d8[0].cache_avail < wVar6)) {
                  if (uVar33 != uVar27) goto LAB_0023a5d5;
                  uVar4 = *(ushort *)
                           (*(long *)(puVar11 + 0x6a) +
                           (ulong)((uint)(local_d8[0].cache_buffer <<
                                         ((char)wVar6 - (char)local_d8[0].cache_avail & 0x3fU)) &
                                  cache_masks[wVar6]) * 2);
                  uVar35 = (ulong)uVar4;
                  if ((int)puVar11[0x52] <= (int)(uint)uVar4) {
                    uVar35 = 0;
                  }
                  local_d8[0].cache_avail =
                       local_d8[0].cache_avail - (uint)*(byte *)(lVar12 + uVar35);
                  if (local_d8[0].cache_avail < L'\0') goto LAB_0023ac72;
                }
                else {
                  uVar4 = *(ushort *)
                           (*(long *)(puVar11 + 0x6a) +
                           (ulong)((uint)(local_d8[0].cache_buffer >>
                                         ((char)local_d8[0].cache_avail - (char)wVar6 & 0x3fU)) &
                                  cache_masks[wVar6]) * 2);
                  uVar35 = (ulong)uVar4;
                  if ((int)puVar11[0x52] <= (int)(uint)uVar4) {
                    uVar35 = 0;
                  }
                  local_d8[0].cache_avail =
                       local_d8[0].cache_avail - (uint)*(byte *)(lVar12 + uVar35);
                }
                uVar44 = (uint)uVar35;
                if (0xff < uVar44) break;
                *(char *)(lVar32 + (int)uVar40) = (char)uVar35;
                uVar40 = uVar40 + 1 & uVar7;
                *__dest = (char)uVar35;
                __dest = __dest + 1;
                uVar39 = uVar39 - 1;
              }
              uVar19 = uVar44 & 7;
              local_158 = uVar44 - 0x100 >> 3;
              break;
            case 0x13:
              break;
            case 0x14:
              goto LAB_0023a1a4;
            case 0x15:
              goto switchD_00239e96_caseD_15;
            case 0x16:
              goto switchD_00239e96_caseD_16;
            default:
              goto switchD_00239e96_default;
            }
            if (uVar19 == 7) {
              if (((wVar17 <= local_d8[0].cache_avail) ||
                  (wVar46 = lzx_br_fillup(strm,local_d8), wVar46 != L'\0')) ||
                 (wVar17 <= local_d8[0].cache_avail)) {
                uVar4 = *(ushort *)
                         (*(long *)(puVar11 + 0x50) +
                         (ulong)((uint)(local_d8[0].cache_buffer >>
                                       ((char)local_d8[0].cache_avail - (char)wVar17 & 0x3fU)) &
                                cache_masks[wVar17]) * 2);
                uVar35 = (ulong)uVar4;
                if ((int)puVar11[0x38] <= (int)(uint)uVar4) {
                  uVar35 = 0;
                }
                iVar31 = (int)uVar35;
                local_d8[0].cache_avail =
                     local_d8[0].cache_avail - (uint)*(byte *)(local_50 + uVar35);
LAB_0023a111:
                uVar18 = iVar31 + 9;
                goto LAB_0023a114;
              }
              if (uVar33 != uVar27) {
                uVar34 = 0x13;
                uVar19 = 7;
                goto LAB_0023a5d5;
              }
              uVar4 = *(ushort *)
                       (*(long *)(puVar11 + 0x50) +
                       (ulong)((uint)(local_d8[0].cache_buffer <<
                                     ((char)wVar17 - (char)local_d8[0].cache_avail & 0x3fU)) &
                              cache_masks[wVar17]) * 2);
              uVar35 = (ulong)uVar4;
              if ((int)puVar11[0x38] <= (int)(uint)uVar4) {
                uVar35 = 0;
              }
              iVar31 = (int)uVar35;
              local_d8[0].cache_avail = local_d8[0].cache_avail - (uint)*(byte *)(local_50 + uVar35)
              ;
              if (L'\xffffffff' < local_d8[0].cache_avail) goto LAB_0023a111;
            }
            else {
              uVar18 = uVar19 + 2;
LAB_0023a114:
              if ((ulong)(long)(int)uVar18 <= uVar39) goto code_r0x0023a125;
            }
            goto LAB_0023ac72;
          }
          goto LAB_0023acca;
        }
        pcVar36 = "Truncated CAB file data";
        goto LAB_0023b2b7;
      }
LAB_0023ad1a:
      if (*(short *)(lVar8 + 6) == 0) {
LAB_0023ad6b:
        if ((10 < (ulong)*(ushort *)(lVar8 + 8)) &&
           (lVar32 = *(long *)((long)pvVar23 + 0x1b8), *(char *)(lVar32 + 0x28) != '\0')) {
          pvVar24 = *(void **)((long)pvVar23 + 0xa0);
          pvVar45 = (void *)((long)pvVar24 + ((ulong)*(ushort *)(lVar8 + 8) - 10));
          if (pvVar24 < pvVar45) {
            iVar22 = *(int *)(*(long *)((long)pvVar23 + 0x28) + 0x58);
            pvVar28 = pvVar24;
            do {
              pvVar28 = memchr(pvVar28,0xe8,(long)pvVar45 - (long)pvVar28);
              if (pvVar28 == (void *)0x0) break;
              iVar31 = ((int)pvVar24 - (int)pvVar28) + iVar22 * -0x8000 + 0x8000;
              uVar18 = (uint)*(byte *)((long)pvVar28 + 4) << 0x18;
              uVar44 = (uint)*(byte *)((long)pvVar28 + 2) << 8 |
                       (uint)*(byte *)((long)pvVar28 + 3) << 0x10 |
                       (uint)*(byte *)((long)pvVar28 + 1) | uVar18;
              if ((iVar31 <= (int)uVar44) &&
                 (iVar30 = *(int *)(lVar32 + 0x24), (int)uVar44 < iVar30)) {
                if ((int)uVar18 < 0) {
                  iVar31 = iVar30;
                }
                *(uint *)((long)pvVar28 + 1) = iVar31 + uVar44;
              }
              pvVar28 = (void *)((long)pvVar28 + 5);
            } while (pvVar28 < pvVar45);
          }
        }
        uVar4 = *(ushort *)(lVar8 + 0xe);
        lVar32 = *(long *)((long)pvVar23 + 0xa0);
        *avail = (uVar27 & 0xffff) - (ulong)uVar4;
        *(short *)(lVar8 + 0xc) = (short)uVar27;
        return (void *)(lVar32 + (ulong)uVar4);
      }
      pvVar24 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar8 + 6),(ssize_t *)local_d8);
      if ((long)local_d8[0].cache_buffer < 1) {
        pcVar36 = "Truncated CAB header";
LAB_0023b2b7:
        archive_set_error(&a->archive,0x54,pcVar36);
      }
      else {
        *(ulong *)(lVar8 + 0x10) = (ulong)*(ushort *)(lVar8 + 6);
        *(void **)(lVar8 + 0x38) = pvVar24;
        iVar25 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar8 + 6));
        if (-1 < iVar25) goto LAB_0023ad6b;
      }
LAB_0023b2de:
      *avail = -0x1e;
LAB_0023b216:
      return (void *)0x0;
    }
    uVar5 = *(ushort *)(*(long *)((long)pvVar23 + 0x28) + 8);
    if (*(long *)((long)pvVar23 + 0x1b8) == 0) {
      pvVar24 = calloc(1,0x220);
      *(void **)((long)pvVar23 + 0x1b8) = pvVar24;
      if (pvVar24 != (void *)0x0) goto LAB_0023af16;
    }
    else {
LAB_0023af16:
      puVar11 = *(undefined4 **)((long)pvVar23 + 0x1b8);
      puVar11[0x87] = 0xffffffe7;
      if (0xfffffff8 < uVar5 - 0x16) {
        puVar11[0x87] = 0xffffffe2;
        iVar22 = puVar11[1];
        uVar44 = slots[uVar5 - 0xf];
        iVar31 = 1 << ((byte)uVar5 & 0x1f);
        puVar11[1] = iVar31;
        puVar11[2] = iVar31 + -1;
        if ((*(void **)(puVar11 + 4) == (void *)0x0) || (iVar22 != iVar31)) {
          free(*(void **)(puVar11 + 4));
          pvVar24 = malloc((long)(int)puVar11[1]);
          *(void **)(puVar11 + 4) = pvVar24;
          if (pvVar24 != (void *)0x0) {
            free(*(void **)(puVar11 + 0x18));
            pvVar24 = malloc((long)(int)uVar44 * 8);
            *(void **)(puVar11 + 0x18) = pvVar24;
            if (pvVar24 != (void *)0x0) goto LAB_0023afb3;
          }
        }
        else {
LAB_0023afb3:
          lVar32 = 0;
          do {
            *(int *)((long)&local_d8[0].cache_buffer + lVar32 * 4) = 1 << ((byte)lVar32 & 0x1f);
            lVar32 = lVar32 + 1;
          } while (lVar32 != 0x12);
          lVar32 = *(long *)(puVar11 + 0x18);
          uVar33 = 1;
          if (1 < (int)uVar44) {
            uVar33 = (ulong)uVar44;
          }
          uVar39 = 0;
          uVar40 = 0;
          uVar18 = 0;
          do {
            if (uVar40 == 0) {
              uVar18 = (uint)uVar39;
            }
            else {
              uVar18 = uVar18 + *(int *)((long)&local_d8[0].cache_buffer + (ulong)uVar40 * 4);
            }
            if (uVar40 < 0x11) {
              uVar40 = 0xfffffffe;
              uVar7 = uVar18;
              if (uVar18 != 0) {
                do {
                  uVar40 = uVar40 + 1;
                  bVar13 = 1 < uVar7;
                  uVar7 = (int)uVar7 >> 1;
                } while (bVar13);
              }
              if ((int)uVar40 < 1) {
                uVar40 = 0;
              }
            }
            *(uint *)(lVar32 + uVar39 * 8) = uVar18;
            *(uint *)(lVar32 + 4 + uVar39 * 8) = uVar40;
            uVar39 = uVar39 + 1;
          } while (uVar39 != uVar33);
          puVar11[6] = 0;
          *puVar11 = 0;
          *(undefined8 *)(puVar11 + 0x1a) = 0;
          puVar11[0x1c] = 0;
          puVar11[0x12] = 1;
          *(undefined8 *)(puVar11 + 0x10) = 0x100000001;
          wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x1e),8,L'\b');
          if ((((wVar17 == L'\0') &&
               (wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x6c),0x14,L'\n'), wVar17 == L'\0'))
              && (wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x52),
                                            (long)(int)(uVar44 * 8 + 0x100),L'\x10'),
                 wVar17 == L'\0')) &&
             (wVar17 = lzx_huffman_init((huffman *)(puVar11 + 0x38),0xf9,L'\x10'), wVar17 == L'\0'))
          {
            puVar11[0x87] = 0;
            *(undefined1 *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) = 1;
            goto LAB_00239a76;
          }
        }
      }
    }
    pcVar36 = "Can\'t initialize LZX decompression.";
  }
  else {
    if (sVar3 != 1) {
      if (sVar3 != 0) {
        archive_set_error(&a->archive,0x54,"Unsupported CAB compression : %s",
                          *(undefined8 *)(lVar8 + 0x10));
        *avail = -0x19;
        return (void *)0x0;
      }
      lVar8 = *(long *)((long)a->format->data + 0x38);
      pvVar23 = __archive_read_ahead(a,1,avail);
      if (0 < *avail) {
        if ((long)(ulong)*(ushort *)(lVar8 + 10) < *avail) {
          *avail = (ulong)*(ushort *)(lVar8 + 10);
        }
        *(undefined2 *)(lVar8 + 0xc) = *(undefined2 *)(lVar8 + 8);
        *(ssize_t *)(lVar8 + 0x10) = *avail;
        *(void **)(lVar8 + 0x38) = pvVar23;
        return pvVar23;
      }
      pcVar36 = "Truncated CAB header";
      iVar22 = 0x54;
LAB_0023b118:
      archive_set_error(&a->archive,iVar22,pcVar36);
      *avail = -0x1e;
      return (void *)0x0;
    }
    pvVar23 = a->format->data;
    lVar8 = *(long *)((long)pvVar23 + 0x38);
    if (*(long *)((long)pvVar23 + 0xa0) == 0) {
      *(undefined8 *)((long)pvVar23 + 0xa8) = 0x8000;
      pvVar24 = malloc(0x8000);
      *(void **)((long)pvVar23 + 0xa0) = pvVar24;
      if (pvVar24 == (void *)0x0) {
        archive_set_error(&a->archive,0xc,"No memory for CAB reader");
        *avail = -0x1e;
        return (void *)0x0;
      }
    }
    uVar4 = *(ushort *)(lVar8 + 0xc);
    if (uVar4 == *(ushort *)(lVar8 + 8)) {
      uVar5 = *(ushort *)(lVar8 + 0xe);
      lVar8 = *(long *)((long)pvVar23 + 0xa0);
      *avail = (ulong)uVar4 - (ulong)uVar5;
      return (void *)((ulong)uVar5 + lVar8);
    }
    if (*(char *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) != '\0') {
LAB_00239819:
      uVar44 = (uint)(*(short *)(lVar8 + 6) == *(short *)(lVar8 + 4)) * 2;
      lVar32 = (long)pvVar23 + 0x110;
      *(ulong *)((long)pvVar23 + 0x138) = (ulong)uVar4;
      uVar18 = 0;
LAB_00239850:
      uVar27 = *(ulong *)((long)pvVar23 + 0x138);
      uVar4 = *(ushort *)(lVar8 + 8);
      if (uVar27 < uVar4) {
        *(ulong *)((long)pvVar23 + 0x128) = *(long *)((long)pvVar23 + 0xa0) + uVar27;
        *(uint *)((long)pvVar23 + 0x130) = (uint)uVar4 - (int)uVar27;
        pcVar36 = (char *)__archive_read_ahead(a,1,(ssize_t *)local_d8);
        if ((long)local_d8[0].cache_buffer < 1) {
          bVar13 = false;
          archive_set_error(&a->archive,0x54,"Truncated CAB header");
LAB_0023998d:
          *avail = -0x1e;
          uVar34 = 1;
        }
        else {
          if ((long)(ulong)*(ushort *)(lVar8 + 6) < (long)local_d8[0].cache_buffer) {
            local_d8[0].cache_buffer = (ulong)*(ushort *)(lVar8 + 6);
          }
          *(char **)((long)pvVar23 + 0x110) = pcVar36;
          *(int *)((long)pvVar23 + 0x118) = (int)local_d8[0].cache_buffer;
          *(undefined8 *)((long)pvVar23 + 0x120) = 0;
          if ((int)uVar44 < 1) {
LAB_0023994b:
            uVar18 = inflate(lVar32,0);
            if (uVar18 == 0) {
              bVar13 = false;
            }
            else {
              uVar37 = 6;
              if (uVar18 != 1) goto LAB_00239a1e;
              bVar13 = true;
            }
            iVar25 = *(int64_t *)((long)pvVar23 + 0x120);
            *(int64_t *)(lVar8 + 0x10) = iVar25;
            *(char **)(lVar8 + 0x38) = pcVar36;
            iVar25 = cab_minimum_consume_cfdata(a,iVar25);
            if (iVar25 < 0) goto LAB_0023998d;
            uVar34 = 0;
          }
          else {
            uVar37 = 4;
            uVar34 = 4;
            if (0 < (long)local_d8[0].cache_buffer) {
              uVar27 = (ulong)uVar44;
              if ((long)uVar27 < (long)local_d8[0].cache_buffer) {
                if (uVar44 == 2) {
                  if ((*pcVar36 != 'C') || (pcVar36[1] != 'K')) goto LAB_002399bf;
                }
                else if ((uVar44 == 1) && (*pcVar36 != 'K')) {
                  uVar44 = 1;
                  goto LAB_00239a1e;
                }
                *(char **)((long)pvVar23 + 0x110) = pcVar36 + uVar27;
                *(uint *)((long)pvVar23 + 0x118) = (int)local_d8[0].cache_buffer - uVar44;
                *(ulong *)((long)pvVar23 + 0x120) = uVar27;
                uVar44 = 0;
                goto LAB_0023994b;
              }
              if (uVar44 == 2) {
                if ((*pcVar36 != 'C') || ((local_d8[0].cache_buffer != 1 && (pcVar36[1] != 'K')))) {
LAB_002399bf:
                  bVar13 = false;
                  uVar44 = 2;
                  goto LAB_00239a24;
                }
              }
              else if (*pcVar36 != 'K') goto LAB_00239a1e;
              *(uint64_t *)(lVar8 + 0x10) = local_d8[0].cache_buffer;
              *(char **)(lVar8 + 0x38) = pcVar36;
              iVar25 = cab_minimum_consume_cfdata(a,local_d8[0].cache_buffer);
              if (iVar25 < 0) {
                *avail = -0x1e;
                uVar34 = 1;
                bVar13 = false;
                goto LAB_00239a24;
              }
              uVar44 = uVar44 - (int)local_d8[0].cache_buffer;
              uVar37 = 2;
            }
LAB_00239a1e:
            uVar34 = uVar37;
            bVar13 = false;
          }
        }
LAB_00239a24:
        switch(uVar34) {
        case 0:
        case 2:
          goto switchD_00239a3d_caseD_0;
        default:
          goto LAB_0023b216;
        case 4:
          archive_set_error(&a->archive,-1,"CFDATA incorrect(no MSZIP signature)");
          *avail = -0x1e;
          return (void *)0x0;
        case 6:
          goto LAB_0023b270;
        }
      }
      goto LAB_0023ae62;
    }
    *(undefined8 *)((long)pvVar23 + 0x110) = 0;
    *(undefined4 *)((long)pvVar23 + 0x118) = 0;
    *(undefined8 *)((long)pvVar23 + 0x138) = 0;
    *(undefined8 *)((long)pvVar23 + 0x120) = 0;
    *(undefined8 *)((long)pvVar23 + 0x128) = 0;
    *(undefined4 *)((long)pvVar23 + 0x130) = 0;
    if (*(char *)((long)pvVar23 + 0x180) == '\0') {
      iVar22 = inflateInit2_((long)pvVar23 + 0x110,0xfffffff1,"1.2.11",0x70);
    }
    else {
      iVar22 = inflateReset();
    }
    if (iVar22 == 0) {
      *(undefined1 *)((long)pvVar23 + 0x180) = 1;
      *(undefined1 *)(*(long *)((long)pvVar23 + 0x28) + 0x5c) = 1;
      goto LAB_00239819;
    }
    pcVar36 = "Can\'t initialize deflate decompression.";
  }
  archive_set_error(&a->archive,-1,pcVar36);
LAB_0023b20b:
  *avail = -0x1e;
  return (void *)0x0;
switchD_00239c17_caseD_4:
  uVar44 = piVar10[0x1c];
  if ((uVar44 & 0xf) == 0) {
    if ((((int)uVar44 < 0x10) && (wVar17 = lzx_br_fillup(strm,br), wVar17 == L'\0')) &&
       (piVar10[0x1c] < 0x10)) {
      *piVar10 = 4;
      goto LAB_0023ac15;
    }
    uVar44 = piVar10[0x1c] - 0x10;
  }
  else {
    uVar44 = uVar44 & 0xfffffff0;
  }
  piVar10[0x1c] = uVar44;
  piVar10[0x14] = 0;
  *piVar10 = 5;
switchD_00239c17_caseD_5:
  do {
    iVar31 = piVar10[0x1c];
    if (iVar31 < 0x20) {
      if (0xf < iVar31) {
        uVar39 = br->cache_buffer;
        iVar42 = 2;
        iVar30 = -0x10;
        puVar38 = (undefined1 *)((long)piVar10 + 0x4d);
        piVar43 = piVar10 + 0x13;
        goto LAB_0023a766;
      }
    }
    else {
      uVar39 = *(ulong *)(piVar10 + 0x1a);
      uVar35 = uVar39 >> ((byte)(iVar31 + -0x10) & 0x3f);
      piVar10[0x1c] = iVar31 + -0x10;
      *(char *)(piVar10 + 0x13) = (char)uVar35;
      *(char *)((long)piVar10 + 0x4d) = (char)(uVar35 >> 8);
      iVar42 = 4;
      iVar30 = -0x20;
      puVar38 = (undefined1 *)((long)piVar10 + 0x4f);
      piVar43 = (int *)((long)piVar10 + 0x4e);
LAB_0023a766:
      uVar39 = uVar39 >> ((byte)(iVar31 + iVar30) & 0x3f);
      piVar10[0x1c] = iVar31 + iVar30;
      *(char *)piVar43 = (char)uVar39;
      *puVar38 = (char)(uVar39 >> 8);
      piVar10[0x14] = iVar42;
    }
    iVar31 = piVar10[0x14];
    if (((long)iVar31 < 4) && (*(char *)((long)piVar10 + 0x75) != '\0')) {
      piVar10[0x14] = iVar31 + 1;
      *(char *)((long)piVar10 + (long)iVar31 + 0x4c) = (char)piVar10[0x1d];
      *(undefined1 *)((long)piVar10 + 0x75) = 0;
    }
    iVar31 = piVar10[0x14];
    while (iVar31 < 4) {
      iVar30 = iVar22;
      if (*(long *)((long)pvVar23 + 400) < 1) goto LAB_0023a89e;
      puVar38 = *(undefined1 **)((long)pvVar23 + 0x188);
      *(undefined1 **)((long)pvVar23 + 0x188) = puVar38 + 1;
      uVar2 = *puVar38;
      piVar10[0x14] = iVar31 + 1;
      *(undefined1 *)((long)piVar10 + (long)iVar31 + 0x4c) = uVar2;
      *(long *)((long)pvVar23 + 400) = *(long *)((long)pvVar23 + 400) + -1;
      iVar31 = piVar10[0x14];
    }
    piVar10[0x14] = 0;
    iVar31 = *piVar10;
    iVar30 = 0;
    if (iVar31 == 7) {
      uVar44 = (uint)*(byte *)((long)piVar10 + 0x4f) << 0x18;
      piVar10[0x12] =
           (uint)*(byte *)((long)piVar10 + 0x4d) << 8 |
           (uint)*(byte *)((long)piVar10 + 0x4e) << 0x10 | (uint)*(byte *)(piVar10 + 0x13) | uVar44;
      iVar31 = 8;
LAB_0023a891:
      if ((int)uVar44 < 0) {
        iVar30 = 5;
      }
      else {
        *piVar10 = iVar31;
      }
    }
    else {
      if (iVar31 == 6) {
        uVar44 = (uint)*(byte *)((long)piVar10 + 0x4f) << 0x18;
        piVar10[0x11] =
             (uint)*(byte *)((long)piVar10 + 0x4d) << 8 |
             (uint)*(byte *)((long)piVar10 + 0x4e) << 0x10 | (uint)*(byte *)(piVar10 + 0x13) |
             uVar44;
        iVar31 = 7;
        goto LAB_0023a891;
      }
      if (iVar31 == 5) {
        uVar44 = (uint)*(byte *)((long)piVar10 + 0x4f) << 0x18;
        piVar10[0x10] =
             (uint)*(byte *)((long)piVar10 + 0x4d) << 8 |
             (uint)*(byte *)((long)piVar10 + 0x4e) << 0x10 | (uint)*(byte *)(piVar10 + 0x13) |
             uVar44;
        iVar31 = 6;
        goto LAB_0023a891;
      }
    }
LAB_0023a89e:
    if (iVar30 != 0) goto joined_r0x0023a987;
  } while (*piVar10 != 8);
switchD_00239c17_caseD_8:
  do {
    if (*(long *)(piVar10 + 0xe) == 0) goto switchD_00239c17_caseD_9;
    uVar39 = *(ulong *)((long)pvVar23 + 0x1a8);
    if ((long)uVar39 < 1) {
      iVar30 = 1;
    }
    else {
      uVar35 = *(ulong *)((long)pvVar23 + 400);
      iVar30 = iVar22;
      if (0 < (long)uVar35) {
        uVar18 = (uint)*(long *)(piVar10 + 0xe);
        uVar44 = piVar10[1] - piVar10[6];
        if ((int)uVar18 <= piVar10[1] - piVar10[6]) {
          uVar44 = uVar18;
        }
        if ((long)(int)uVar44 <= (long)uVar39) {
          uVar39 = (ulong)uVar44;
        }
        if ((long)(int)uVar39 <= (long)uVar35) {
          uVar35 = uVar39 & 0xffffffff;
        }
        __n = (size_t)(int)uVar35;
        memcpy(*(void **)((long)pvVar23 + 0x1a0),*(void **)((long)pvVar23 + 0x188),__n);
        memcpy((void *)((long)piVar10[6] + *(long *)(piVar10 + 4)),*(void **)((long)pvVar23 + 0x188)
               ,__n);
        *(long *)((long)pvVar23 + 0x188) = *(long *)((long)pvVar23 + 0x188) + __n;
        *(long *)((long)pvVar23 + 400) = *(long *)((long)pvVar23 + 400) - __n;
        *(long *)((long)pvVar23 + 0x1a0) = *(long *)((long)pvVar23 + 0x1a0) + __n;
        *(long *)((long)pvVar23 + 0x1a8) = *(long *)((long)pvVar23 + 0x1a8) - __n;
        *(long *)((long)pvVar23 + 0x1b0) = *(long *)((long)pvVar23 + 0x1b0) + __n;
        piVar10[6] = piVar10[6] + (int)uVar35 & piVar10[2];
        *(size_t *)(piVar10 + 0xe) = *(long *)(piVar10 + 0xe) - __n;
        iVar30 = 0;
      }
    }
  } while (iVar30 == 0);
joined_r0x0023a987:
  if (iVar30 != 5) {
LAB_0023ac32:
    uVar44 = 0;
    goto LAB_0023aca9;
  }
LAB_0023ac21:
  piVar10[0x87] = -0x19;
  uVar44 = 0xffffffe7;
  goto LAB_0023aca9;
switchD_00239c17_caseD_9:
  if ((*(byte *)(piVar10 + 0xc) & 1) != 0) {
    if (*(long *)((long)pvVar23 + 400) < 1) {
      *piVar10 = 9;
LAB_0023ac15:
      if (uVar33 != uVar27) goto LAB_0023ac32;
      goto LAB_0023ac21;
    }
    *(long *)((long)pvVar23 + 0x188) = *(long *)((long)pvVar23 + 0x188) + 1;
    *(long *)((long)pvVar23 + 400) = *(long *)((long)pvVar23 + 400) + -1;
  }
  *piVar10 = 2;
  uVar44 = 1;
LAB_0023aca9:
  if (uVar44 != 100) goto code_r0x0023acb7;
  goto LAB_00239bec;
code_r0x0023a125:
  uVar37 = 0x15;
  uVar44 = local_164;
  if (local_158 == 0) goto switchD_00239e96_default;
  if (local_158 == 2) {
    local_158 = 2;
    uVar44 = local_13c;
    uVar29 = local_164;
    local_164 = local_13c;
    goto switchD_00239e96_default;
  }
  if (local_158 == 1) {
    local_158 = 1;
    uVar44 = local_144;
    uVar14 = local_164;
    local_164 = local_144;
    goto switchD_00239e96_default;
  }
  local_88 = (ulong)*(uint *)(local_58 + 4 + (long)(int)local_158 * 8);
LAB_0023a1a4:
  wVar46 = (wchar_t)local_88;
  if ((cVar1 == '\x02') && (L'\x02' < wVar46)) {
    wVar46 = wVar46 + L'\xfffffffd';
    if (((wVar46 <= local_d8[0].cache_avail) ||
        (wVar20 = lzx_br_fillup(strm,local_d8), wVar20 != L'\0')) ||
       (uVar37 = 0x14, uVar44 = local_70, wVar46 <= local_d8[0].cache_avail)) {
      uVar41 = ((uint)(local_d8[0].cache_buffer >>
                      ((char)local_d8[0].cache_avail - (char)wVar46 & 0x3fU)) &
               cache_masks[(uint)wVar46]) * 8;
      wVar20 = (int)local_80 + wVar46;
      uVar37 = uVar34;
      if (((local_d8[0].cache_avail < wVar20) &&
          (wVar21 = lzx_br_fillup(strm,local_d8), wVar21 == L'\0')) &&
         (local_d8[0].cache_avail < wVar20)) {
        if (uVar33 == uVar27) {
          uVar4 = *(ushort *)
                   (*(long *)(puVar11 + 0x36) +
                   (ulong)((uint)(local_d8[0].cache_buffer <<
                                 ((char)local_80 - (char)(local_d8[0].cache_avail - wVar46) & 0x3fU)
                                 ) & cache_masks[local_80]) * 2);
          uVar35 = (ulong)uVar4;
          if ((int)puVar11[0x1e] <= (int)(uint)uVar4) {
            uVar35 = 0;
          }
          local_d8[0].cache_avail =
               (local_d8[0].cache_avail - wVar46) - (uint)*(byte *)(local_60 + uVar35);
          if (L'\xffffffff' < local_d8[0].cache_avail) goto LAB_0023a426;
          uVar44 = 8;
        }
        else {
          uVar44 = 7;
          uVar37 = 0x14;
        }
      }
      else {
        uVar4 = *(ushort *)
                 (*(long *)(puVar11 + 0x36) +
                 (ulong)((uint)(local_d8[0].cache_buffer >>
                               ((char)(local_d8[0].cache_avail - wVar46) - (char)local_80 & 0x3fU))
                        & cache_masks[local_80]) * 2);
        uVar35 = (ulong)uVar4;
        if ((int)puVar11[0x1e] <= (int)(uint)uVar4) {
          uVar35 = 0;
        }
        local_d8[0].cache_avail =
             (local_d8[0].cache_avail - wVar46) - (uint)*(byte *)(local_60 + uVar35);
LAB_0023a426:
        uVar41 = (int)uVar35 + uVar41;
        uVar44 = 0;
      }
    }
    uVar34 = uVar37;
    if (uVar44 != 0) {
      if (uVar44 == 7) goto LAB_0023a5d5;
      if (uVar44 != 8) goto LAB_0023ac87;
LAB_0023ac72:
      puVar11[0x87] = 0xffffffe7;
      uVar44 = 0xffffffe7;
LAB_0023ac87:
      lVar32 = local_38 - *(long *)((long)pvVar23 + 0x1a8);
      *(long *)((long)pvVar23 + 0x1a0) = *(long *)((long)pvVar23 + 0x1a0) + lVar32;
      *(long *)((long)pvVar23 + 0x1b0) = *(long *)((long)pvVar23 + 0x1b0) + lVar32;
      goto LAB_0023aca9;
    }
  }
  else {
    if ((local_d8[0].cache_avail < wVar46) &&
       ((wVar46 = lzx_br_fillup(strm,local_d8), wVar46 == L'\0' &&
        (local_d8[0].cache_avail < (wchar_t)local_88)))) {
      uVar34 = 0x14;
      if (uVar33 == uVar27) goto LAB_0023ac72;
      goto LAB_0023a5d5;
    }
    local_d8[0].cache_avail = local_d8[0].cache_avail - (int)local_88;
    uVar41 = (uint)(local_d8[0].cache_buffer >> ((byte)local_d8[0].cache_avail & 0x3f)) &
             cache_masks[(int)local_88];
  }
  uVar41 = (uVar41 + *(int *)(local_58 + (long)(int)local_158 * 8)) - 2;
  local_13c = local_144;
  uVar15 = uVar41;
  local_144 = local_164;
switchD_00239e96_caseD_15:
  local_164 = uVar15;
  uVar41 = uVar40 - uVar41 & uVar7;
switchD_00239e96_caseD_16:
  uVar37 = uVar34;
  do {
    uVar44 = uVar40;
    if ((int)uVar40 < (int)uVar41) {
      uVar44 = uVar41;
    }
    uVar29 = local_6c - uVar44;
    if ((int)uVar18 < (int)(local_6c - uVar44)) {
      uVar29 = uVar18;
    }
    if (puVar38 <= __dest + (int)uVar29) {
      uVar29 = (int)puVar38 - (int)__dest;
    }
    pvVar24 = (void *)((int)uVar41 + lVar32);
    if (((int)uVar29 < 8) ||
       (((int)uVar40 <= (int)(uVar41 + uVar29) && ((int)uVar41 <= (int)(uVar40 + uVar29))))) {
      if (0 < (int)uVar29) {
        uVar35 = 0;
        do {
          uVar2 = *(undefined1 *)((long)pvVar24 + uVar35);
          *(undefined1 *)((int)uVar40 + lVar32 + uVar35) = uVar2;
          __dest[uVar35] = uVar2;
          uVar35 = uVar35 + 1;
        } while (uVar29 != uVar35);
      }
    }
    else {
      local_40 = (size_t)uVar29;
      memcpy((void *)((int)uVar40 + lVar32),pvVar24,local_40);
      memcpy(__dest,pvVar24,local_40);
    }
    __dest = __dest + (int)uVar29;
    uVar41 = uVar41 + uVar29 & uVar7;
    uVar40 = uVar40 + uVar29 & uVar7;
    uVar39 = uVar39 - (long)(int)uVar29;
    uVar34 = 0x16;
    if (__dest < puVar38) {
      uVar34 = uVar37;
    }
    iVar31 = 7;
    if (__dest < puVar38) {
      iVar31 = 0;
    }
    uVar14 = uVar29;
    if ((int)uVar18 <= (int)uVar29) {
      uVar34 = uVar37;
      uVar14 = 0;
    }
    uVar44 = 10;
    if ((int)uVar18 <= (int)uVar29) {
      iVar31 = 10;
    }
    uVar18 = uVar18 - uVar14;
    uVar37 = uVar34;
  } while (iVar31 == 0);
  if (iVar31 != 7) {
    if (iVar31 != 10) goto LAB_0023ac87;
    uVar37 = 0x12;
    uVar44 = uVar41;
    uVar29 = local_13c;
    uVar14 = local_144;
    goto switchD_00239e96_default;
  }
LAB_0023a5d5:
  *local_48 = (int)local_d8[0].cache_buffer;
  local_48[1] = local_d8[0].cache_buffer._4_4_;
  local_48[2] = local_d8[0].cache_avail;
  local_48[3] = local_d8[0]._12_4_;
  *(ulong *)(puVar11 + 0xe) = uVar39;
  puVar11[8] = uVar18;
  puVar11[7] = uVar41;
  puVar11[0x15] = uVar19;
  puVar11[0x17] = (int)local_88;
  puVar11[0x16] = local_158;
  puVar11[0x10] = local_164;
  puVar11[0x11] = local_144;
  puVar11[0x12] = local_13c;
  *puVar11 = uVar34;
  puVar11[6] = uVar40;
  *(long *)((long)pvVar23 + 0x1a8) = (long)puVar38 - (long)__dest;
  uVar44 = 0;
  goto LAB_0023ac87;
code_r0x0023acb7:
  *(long *)((long)pvVar23 + 0x198) =
       *(long *)((long)pvVar23 + 0x198) + (uVar33 - *(long *)((long)pvVar23 + 400));
LAB_0023acca:
  if (1 < uVar44) {
    archive_set_error(&a->archive,-1,"LZX decompression failed (%d)");
    goto LAB_0023b2de;
  }
  iVar25 = *(int64_t *)((long)pvVar23 + 0x198);
  *(int64_t *)(lVar8 + 0x10) = iVar25;
  *(byte **)(lVar8 + 0x38) = local_68;
  iVar25 = cab_minimum_consume_cfdata(a,iVar25);
  if (iVar25 < 0) goto LAB_0023b2de;
  uVar27 = *(ulong *)((long)pvVar23 + 0x1b0);
  uVar33 = (ulong)*(ushort *)(lVar8 + 8);
  if ((long)uVar33 <= (long)uVar27) goto LAB_0023ad1a;
  goto LAB_00239aac;
switchD_00239a3d_caseD_0:
  if (bVar13) goto LAB_0023ae62;
  goto LAB_00239850;
LAB_0023ae62:
  uVar27 = *(ulong *)((long)pvVar23 + 0x138);
  uVar33 = uVar27 & 0xffff;
  if ((uint)*(ushort *)(lVar8 + 8) <= (uint)uVar33) {
    if (*(short *)(lVar8 + 6) != 0) {
      pvVar24 = __archive_read_ahead(a,(ulong)*(ushort *)(lVar8 + 6),(ssize_t *)local_d8);
      if ((long)local_d8[0].cache_buffer < 1) {
        archive_set_error(&a->archive,0x54,"Truncated CAB header");
        goto LAB_0023b308;
      }
      *(ulong *)(lVar8 + 0x10) = (ulong)*(ushort *)(lVar8 + 6);
      *(void **)(lVar8 + 0x38) = pvVar24;
      iVar25 = cab_minimum_consume_cfdata(a,(ulong)*(ushort *)(lVar8 + 6));
      if (iVar25 < 0) goto LAB_0023b308;
    }
    if (((int)(uint)*(ushort *)(*(long *)((long)pvVar23 + 0x28) + 4) <=
         *(int *)(*(long *)((long)pvVar23 + 0x28) + 0x58)) ||
       ((uVar18 = inflateReset(lVar32), uVar18 == 0 &&
        (uVar18 = inflateSetDictionary
                            (lVar32,*(undefined8 *)((long)pvVar23 + 0xa0),*(undefined2 *)(lVar8 + 8)
                            ), uVar18 == 0)))) {
      uVar4 = *(ushort *)(lVar8 + 0xe);
      lVar32 = *(long *)((long)pvVar23 + 0xa0);
      *avail = uVar33 - uVar4;
      *(short *)(lVar8 + 0xc) = (short)uVar27;
      return (void *)((ulong)uVar4 + lVar32);
    }
LAB_0023b270:
    if (uVar18 == 0xfffffffc) {
      archive_set_error(&a->archive,0xc,"Out of memory for deflate decompression");
    }
    else {
      archive_set_error(&a->archive,-1,"Deflate decompression failed (%d)",(ulong)uVar18);
    }
LAB_0023b308:
    *avail = -0x1e;
    return (void *)0x0;
  }
  archive_set_error(&a->archive,-1,"Invalid uncompressed size (%d < %d)",uVar33);
  goto LAB_0023b20b;
}

Assistant:

static const void *
cab_read_ahead_cfdata(struct archive_read *a, ssize_t *avail)
{
	struct cab *cab = (struct cab *)(a->format->data);
	int err;

	err = cab_next_cfdata(a);
	if (err < ARCHIVE_OK) {
		*avail = err;
		return (NULL);
	}

	switch (cab->entry_cffolder->comptype) {
	case COMPTYPE_NONE:
		return (cab_read_ahead_cfdata_none(a, avail));
	case COMPTYPE_MSZIP:
		return (cab_read_ahead_cfdata_deflate(a, avail));
	case COMPTYPE_LZX:
		return (cab_read_ahead_cfdata_lzx(a, avail));
	default: /* Unsupported compression. */
		archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT,
		    "Unsupported CAB compression : %s",
		    cab->entry_cffolder->compname);
		*avail = ARCHIVE_FAILED;
		return (NULL);
	}
}